

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

void __thiscall basisu::image::image(image *this,image *other)

{
  this->m_width = 0;
  this->m_height = 0;
  this->m_pitch = 0;
  (this->m_pixels).m_p = (color_rgba *)0x0;
  (this->m_pixels).m_size = 0;
  (this->m_pixels).m_capacity = 0;
  operator=(this,other);
  return;
}

Assistant:

image(const image &other) :
			m_width(0), m_height(0), m_pitch(0)
		{
			*this = other;
		}